

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O0

void c352_write_rom(void *chip,UINT32 offset,UINT32 length,UINT8 *data)

{
  C352 *c;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *chip_local;
  
  if (offset <= *(uint *)((long)chip + 0x498)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)chip + 0x498) < offset + length) {
      data_local._0_4_ = *(int *)((long)chip + 0x498) - offset;
    }
    memcpy((void *)(*(long *)((long)chip + 0x490) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void c352_write_rom(void *chip, UINT32 offset, UINT32 length, const UINT8* data)
{
	C352 *c = (C352 *)chip;
	
	if (offset > c->wavesize)
		return;
	if (offset + length > c->wavesize)
		length = c->wavesize - offset;
	
	memcpy(c->wave + offset, data, length);
	
	return;
}